

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O2

TrackData * GenerateSystem24Track(TrackData *__return_storage_ptr__,CylHead *cylhead,Track *track)

{
  pointer pSVar1;
  bool bVar2;
  BitBuffer *bitstream;
  int gap3_bytes;
  Sector *s;
  pointer sector;
  BitstreamTrackBuilder bitbuf;
  
  bVar2 = IsSystem24Track(track);
  if (bVar2) {
    BitstreamTrackBuilder::BitstreamTrackBuilder(&bitbuf,_500K,MFM);
    pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (sector = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                  super__Vector_impl_data._M_start; sector != pSVar1; sector = sector + 1) {
      gap3_bytes = 0x34;
      if (5 < (sector->header).sector) {
        gap3_bytes = 0x29;
      }
      TrackBuilder::addSector(&bitbuf.super_TrackBuilder,sector,gap3_bytes);
    }
    bitstream = BitstreamTrackBuilder::buffer(&bitbuf);
    TrackData::TrackData(__return_storage_ptr__,cylhead,bitstream);
    BitBuffer::~BitBuffer(&bitbuf.m_buffer);
    return __return_storage_ptr__;
  }
  __assert_fail("IsSystem24Track(track)",
                "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/SpecialFormat.cpp"
                ,0x92,"TrackData GenerateSystem24Track(const CylHead &, const Track &)");
}

Assistant:

TrackData GenerateSystem24Track(const CylHead& cylhead, const Track& track)
{
    assert(IsSystem24Track(track));

    BitstreamTrackBuilder bitbuf(DataRate::_500K, Encoding::MFM);

    for (auto& s : track)
    {
        auto gap3{ (s.header.sector < 6) ? 52 : 41 };
        bitbuf.addSector(s, gap3);
    }

    return TrackData(cylhead, std::move(bitbuf.buffer()));
}